

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void icu_63::cacheInit(UErrorCode *status)

{
  UnifiedCache *this;
  code *size;
  
  size = unifiedcache_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_UNIFIED_CACHE,unifiedcache_cleanup);
  this = (UnifiedCache *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
  if (this == (UnifiedCache *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    UnifiedCache::UnifiedCache(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      gCache = this;
      return;
    }
    gCache = this;
    (*(this->super_UnifiedCacheBase).super_UObject._vptr_UObject[1])(this);
  }
  gCache = (UnifiedCache *)0x0;
  return;
}

Assistant:

static void U_CALLCONV cacheInit(UErrorCode &status) {
    U_ASSERT(gCache == NULL);
    ucln_common_registerCleanup(
            UCLN_COMMON_UNIFIED_CACHE, unifiedcache_cleanup);

    gCache = new UnifiedCache(status);
    if (gCache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(status)) {
        delete gCache;
        gCache = NULL;
        return;
    }
}